

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O0

uint ExtractInt(uchar *in)

{
  uint return_value;
  uchar *in_local;
  
  return (uint)in[3] + (uint)in[2] * 0x100 + (uint)in[1] * 0x10000 + (uint)*in * 0x1000000;
}

Assistant:

unsigned int ExtractInt(const unsigned char* in)
{
   unsigned int return_value;
#ifdef BIG_ENDIAN
   return_value = in[3]
      + (in[2] << 8)
      + (in[1] << 16)
      + (in[0] << 24);
#else
   return_value = in[0]
      + (in[1] << 8)
      + (in[2] << 16)
      + (in[3] << 24);

#endif

   return return_value;
}